

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::vector
          (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *this,
          size_t count,ShapeHandle *value,polymorphic_allocator<pbrt::ShapeHandle> *alloc)

{
  undefined8 *in_RCX;
  size_t in_RDX;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *in_RSI;
  polymorphic_allocator<pbrt::ShapeHandle> *in_RDI;
  size_t i;
  ShapeHandle *in_stack_ffffffffffffffc8;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *local_28;
  
  in_RDI->memoryResource = (memory_resource *)*in_RCX;
  in_RDI[1].memoryResource = (memory_resource *)0x0;
  in_RDI[2].memoryResource = (memory_resource *)0x0;
  in_RDI[3].memoryResource = (memory_resource *)0x0;
  reserve(in_RSI,in_RDX);
  for (local_28 = (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *
                  )0x0; local_28 < in_RSI;
      local_28 = (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *)
                 ((long)&(local_28->alloc).memoryResource + 1)) {
    pmr::polymorphic_allocator<pbrt::ShapeHandle>::
    construct<pbrt::ShapeHandle,pbrt::ShapeHandle_const&>
              (in_RDI,in_stack_ffffffffffffffc8,(ShapeHandle *)0x4db373);
  }
  in_RDI[3].memoryResource = (memory_resource *)in_RSI;
  return;
}

Assistant:

vector(size_t count, const T &value, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(count);
        for (size_t i = 0; i < count; ++i)
            this->alloc.template construct<T>(ptr + i, value);
        nStored = count;
    }